

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
::on_replacement_field
          (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
           *this,char *p)

{
  iterator iVar1;
  arg_formatter<fmt::v6::buffer_range<char>_> local_38;
  
  advance_to<char,fmt::v6::detail::error_handler>(&this->parse_context,p);
  local_38.super_arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>.
  out_.container = (this->context).out_.container;
  local_38.super_arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>.
  locale_.locale_ = (this->context).loc_.locale_;
  local_38.super_arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>.
  specs_ = (format_specs *)0x0;
  local_38.ctx_ = &this->context;
  local_38.parse_ctx_ = &this->parse_context;
  iVar1 = visit_format_arg<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>
                    (&local_38,&this->arg);
  (this->context).out_.container = iVar1.container;
  return;
}

Assistant:

void on_replacement_field(const Char* p) {
    advance_to(parse_context, p);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context), arg));
  }